

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O0

void __thiscall capnp::compiler::NodeTranslator::compileEnum(NodeTranslator *this)

{
  uint uVar1;
  Reader ordinal;
  Reader annotations;
  undefined4 index;
  bool bVar2;
  size_type sVar3;
  reference ppVar4;
  Iterator IVar5;
  Reader value;
  ArrayPtr<const_char> value_00;
  ArrayPtr<const_char> local_478;
  Reader local_468;
  Orphan<capnp::List<capnp::schema::Annotation,_(capnp::Kind)3>_> local_438;
  Reader local_418;
  ArrayPtr<const_char> local_3e8;
  undefined1 local_3d8 [8];
  Builder enumerantBuilder;
  Builder local_3a0;
  Reader local_378;
  Reader local_348;
  undefined1 auStack_318 [8];
  Reader enumerantDecl;
  uint16_t local_2dc;
  uint codeOrder_1;
  pair<const_unsigned_int,_std::pair<unsigned_int,_capnp::compiler::Declaration::Reader>_> *entry;
  iterator __end2_1;
  iterator __begin2_1;
  multimap<unsigned_int,_std::pair<unsigned_int,_capnp::compiler::Declaration::Reader>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<unsigned_int,_capnp::compiler::Declaration::Reader>_>_>_>
  *__range2_1;
  DuplicateOrdinalDetector dupDetector;
  undefined1 local_268 [4];
  uint i;
  undefined1 local_240 [8];
  Builder sourceInfoList;
  undefined1 local_1f0 [8];
  Builder list;
  uint local_1bc;
  pair<unsigned_int,_capnp::compiler::Declaration::Reader> local_1b8;
  Reader local_180;
  Reader local_150;
  uint64_t local_120;
  pair<unsigned_long,_std::pair<unsigned_int,_capnp::compiler::Declaration::Reader>_> local_118;
  undefined1 local_d8 [8];
  Reader member;
  undefined1 local_98 [8];
  Iterator __end2;
  undefined1 local_68 [8];
  Iterator __begin2;
  Reader *__range2;
  undefined1 local_48 [4];
  uint codeOrder;
  multimap<unsigned_int,_std::pair<unsigned_int,_capnp::compiler::Declaration::Reader>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<unsigned_int,_capnp::compiler::Declaration::Reader>_>_>_>
  enumerants;
  NodeTranslator *this_local;
  
  enumerants._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)this;
  std::
  multimap<unsigned_int,_std::pair<unsigned_int,_capnp::compiler::Declaration::Reader>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<unsigned_int,_capnp::compiler::Declaration::Reader>_>_>_>
  ::multimap((multimap<unsigned_int,_std::pair<unsigned_int,_capnp::compiler::Declaration::Reader>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<unsigned_int,_capnp::compiler::Declaration::Reader>_>_>_>
              *)local_48);
  __range2._4_4_ = 0;
  __begin2._8_8_ = (Reader *)&stack0x00000008;
  IVar5 = List<capnp::compiler::Declaration,_(capnp::Kind)3>::Reader::begin
                    ((Reader *)&stack0x00000008);
  __end2._8_8_ = IVar5.container;
  __begin2.container._0_4_ = IVar5.index;
  local_68 = (undefined1  [8])__end2._8_8_;
  IVar5 = List<capnp::compiler::Declaration,_(capnp::Kind)3>::Reader::end((Reader *)__begin2._8_8_);
  member._reader._40_8_ = IVar5.container;
  __end2.container._0_4_ = IVar5.index;
  local_98 = (undefined1  [8])member._reader._40_8_;
  while (bVar2 = capnp::_::
                 IndexingIterator<const_capnp::List<capnp::compiler::Declaration,_(capnp::Kind)3>::Reader,_capnp::compiler::Declaration::Reader>
                 ::operator!=((IndexingIterator<const_capnp::List<capnp::compiler::Declaration,_(capnp::Kind)3>::Reader,_capnp::compiler::Declaration::Reader>
                               *)local_68,
                              (IndexingIterator<const_capnp::List<capnp::compiler::Declaration,_(capnp::Kind)3>::Reader,_capnp::compiler::Declaration::Reader>
                               *)local_98), bVar2) {
    capnp::_::
    IndexingIterator<const_capnp::List<capnp::compiler::Declaration,_(capnp::Kind)3>::Reader,_capnp::compiler::Declaration::Reader>
    ::operator*((Reader *)local_d8,
                (IndexingIterator<const_capnp::List<capnp::compiler::Declaration,_(capnp::Kind)3>::Reader,_capnp::compiler::Declaration::Reader>
                 *)local_68);
    bVar2 = Declaration::Reader::isEnumerant((Reader *)local_d8);
    if (bVar2) {
      Declaration::Reader::getId(&local_180,(Reader *)local_d8);
      Declaration::Id::Reader::getOrdinal(&local_150,&local_180);
      local_120 = LocatedInteger::Reader::getValue(&local_150);
      local_1bc = __range2._4_4_;
      std::make_pair<unsigned_int,capnp::compiler::Declaration::Reader&>
                (&local_1b8,&local_1bc,(Reader *)local_d8);
      std::make_pair<unsigned_long,std::pair<unsigned_int,capnp::compiler::Declaration::Reader>>
                (&local_118,&local_120,&local_1b8);
      list.builder._32_8_ =
           std::
           multimap<unsigned_int,std::pair<unsigned_int,capnp::compiler::Declaration::Reader>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::pair<unsigned_int,capnp::compiler::Declaration::Reader>>>>
           ::
           insert<std::pair<unsigned_long,std::pair<unsigned_int,capnp::compiler::Declaration::Reader>>>
                     ((multimap<unsigned_int,std::pair<unsigned_int,capnp::compiler::Declaration::Reader>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::pair<unsigned_int,capnp::compiler::Declaration::Reader>>>>
                       *)local_48,&local_118);
      __range2._4_4_ = __range2._4_4_ + 1;
    }
    capnp::_::
    IndexingIterator<const_capnp::List<capnp::compiler::Declaration,_(capnp::Kind)3>::Reader,_capnp::compiler::Declaration::Reader>
    ::operator++((IndexingIterator<const_capnp::List<capnp::compiler::Declaration,_(capnp::Kind)3>::Reader,_capnp::compiler::Declaration::Reader>
                  *)local_68);
  }
  capnp::schema::Node::Builder::initEnum
            ((Builder *)&sourceInfoList.builder.structDataSize,(Builder *)&stack0x00000038);
  sVar3 = std::
          multimap<unsigned_int,_std::pair<unsigned_int,_capnp::compiler::Declaration::Reader>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<unsigned_int,_capnp::compiler::Declaration::Reader>_>_>_>
          ::size((multimap<unsigned_int,_std::pair<unsigned_int,_capnp::compiler::Declaration::Reader>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<unsigned_int,_capnp::compiler::Declaration::Reader>_>_>_>
                  *)local_48);
  capnp::schema::Node::Enum::Builder::initEnumerants
            ((Builder *)local_1f0,(Builder *)&sourceInfoList.builder.structDataSize,(uint)sVar3);
  Orphan<capnp::schema::Node::SourceInfo>::get
            ((BuilderFor<capnp::schema::Node::SourceInfo> *)local_268,&this->sourceInfo);
  sVar3 = std::
          multimap<unsigned_int,_std::pair<unsigned_int,_capnp::compiler::Declaration::Reader>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<unsigned_int,_capnp::compiler::Declaration::Reader>_>_>_>
          ::size((multimap<unsigned_int,_std::pair<unsigned_int,_capnp::compiler::Declaration::Reader>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<unsigned_int,_capnp::compiler::Declaration::Reader>_>_>_>
                  *)local_48);
  capnp::schema::Node::SourceInfo::Builder::initMembers
            ((Builder *)local_240,(Builder *)local_268,(uint)sVar3);
  dupDetector.lastOrdinalLocation.ptr.field_1._44_4_ = 0;
  DuplicateOrdinalDetector::DuplicateOrdinalDetector
            ((DuplicateOrdinalDetector *)&__range2_1,this->errorReporter);
  __end2_1 = std::
             multimap<unsigned_int,_std::pair<unsigned_int,_capnp::compiler::Declaration::Reader>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<unsigned_int,_capnp::compiler::Declaration::Reader>_>_>_>
             ::begin((multimap<unsigned_int,_std::pair<unsigned_int,_capnp::compiler::Declaration::Reader>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<unsigned_int,_capnp::compiler::Declaration::Reader>_>_>_>
                      *)local_48);
  entry = (pair<const_unsigned_int,_std::pair<unsigned_int,_capnp::compiler::Declaration::Reader>_>
           *)std::
             multimap<unsigned_int,_std::pair<unsigned_int,_capnp::compiler::Declaration::Reader>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<unsigned_int,_capnp::compiler::Declaration::Reader>_>_>_>
             ::end((multimap<unsigned_int,_std::pair<unsigned_int,_capnp::compiler::Declaration::Reader>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<unsigned_int,_capnp::compiler::Declaration::Reader>_>_>_>
                    *)local_48);
  while( true ) {
    bVar2 = std::operator!=(&__end2_1,(_Self *)&entry);
    if (!bVar2) break;
    ppVar4 = std::
             _Rb_tree_iterator<std::pair<const_unsigned_int,_std::pair<unsigned_int,_capnp::compiler::Declaration::Reader>_>_>
             ::operator*(&__end2_1);
    uVar1 = (ppVar4->second).first;
    auStack_318 = (undefined1  [8])(ppVar4->second).second._reader.segment;
    enumerantDecl._reader.segment = (SegmentReader *)(ppVar4->second).second._reader.capTable;
    enumerantDecl._reader.capTable = (CapTableReader *)(ppVar4->second).second._reader.data;
    enumerantDecl._reader.data = (ppVar4->second).second._reader.pointers;
    enumerantDecl._reader.pointers = *(WirePointer **)&(ppVar4->second).second._reader.dataSize;
    enumerantDecl._reader.dataSize = (ppVar4->second).second._reader.nestingLimit;
    enumerantDecl._reader.pointerCount =
         *(StructPointerCount *)&(ppVar4->second).second._reader.field_0x2c;
    enumerantDecl._reader._38_2_ = *(undefined2 *)&(ppVar4->second).second._reader.field_0x2e;
    Declaration::Reader::getId(&local_378,(Reader *)auStack_318);
    Declaration::Id::Reader::getOrdinal(&local_348,&local_378);
    ordinal._reader.capTable = local_348._reader.capTable;
    ordinal._reader.segment = local_348._reader.segment;
    ordinal._reader.data = local_348._reader.data;
    ordinal._reader.pointers = local_348._reader.pointers;
    ordinal._reader.dataSize = local_348._reader.dataSize;
    ordinal._reader.pointerCount = local_348._reader.pointerCount;
    ordinal._reader._38_2_ = local_348._reader._38_2_;
    ordinal._reader.nestingLimit = local_348._reader.nestingLimit;
    ordinal._reader._44_4_ = local_348._reader._44_4_;
    DuplicateOrdinalDetector::check((DuplicateOrdinalDetector *)&__range2_1,ordinal);
    bVar2 = Declaration::Reader::hasDocComment((Reader *)auStack_318);
    if (bVar2) {
      List<capnp::schema::Node::SourceInfo::Member,_(capnp::Kind)3>::Builder::operator[]
                (&local_3a0,(Builder *)local_240,dupDetector.lastOrdinalLocation.ptr.field_1._44_4_)
      ;
      value = Declaration::Reader::getDocComment((Reader *)auStack_318);
      enumerantBuilder._builder._32_8_ = value.super_StringPtr.content.ptr;
      capnp::schema::Node::SourceInfo::Member::Builder::setDocComment(&local_3a0,value);
    }
    index = dupDetector.lastOrdinalLocation.ptr.field_1._44_4_;
    dupDetector.lastOrdinalLocation.ptr.field_1._44_4_ =
         dupDetector.lastOrdinalLocation.ptr.field_1._44_4_ + 1;
    List<capnp::schema::Enumerant,_(capnp::Kind)3>::Builder::operator[]
              ((Builder *)local_3d8,(Builder *)local_1f0,index);
    Declaration::Reader::getName(&local_418,(Reader *)auStack_318);
    value_00 = (ArrayPtr<const_char>)LocatedText::Reader::getValue(&local_418);
    local_3e8 = value_00;
    capnp::schema::Enumerant::Builder::setName((Builder *)local_3d8,(Reader)value_00);
    local_2dc = (uint16_t)uVar1;
    capnp::schema::Enumerant::Builder::setCodeOrder((Builder *)local_3d8,local_2dc);
    Declaration::Reader::getAnnotations(&local_468,(Reader *)auStack_318);
    kj::StringPtr::StringPtr((StringPtr *)&local_478,"targetsEnumerant");
    annotations.reader.capTable = local_468.reader.capTable;
    annotations.reader.segment = local_468.reader.segment;
    annotations.reader.ptr = local_468.reader.ptr;
    annotations.reader.elementCount = local_468.reader.elementCount;
    annotations.reader.step = local_468.reader.step;
    annotations.reader.structDataSize = local_468.reader.structDataSize;
    annotations.reader.structPointerCount = local_468.reader.structPointerCount;
    annotations.reader.elementSize = local_468.reader.elementSize;
    annotations.reader._39_1_ = local_468.reader._39_1_;
    annotations.reader.nestingLimit = local_468.reader.nestingLimit;
    annotations.reader._44_4_ = local_468.reader._44_4_;
    compileAnnotationApplications(&local_438,this,annotations,(StringPtr)local_478);
    capnp::schema::Enumerant::Builder::adoptAnnotations((Builder *)local_3d8,&local_438);
    Orphan<capnp::List<capnp::schema::Annotation,_(capnp::Kind)3>_>::~Orphan(&local_438);
    std::
    _Rb_tree_iterator<std::pair<const_unsigned_int,_std::pair<unsigned_int,_capnp::compiler::Declaration::Reader>_>_>
    ::operator++(&__end2_1);
  }
  DuplicateOrdinalDetector::~DuplicateOrdinalDetector((DuplicateOrdinalDetector *)&__range2_1);
  std::
  multimap<unsigned_int,_std::pair<unsigned_int,_capnp::compiler::Declaration::Reader>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<unsigned_int,_capnp::compiler::Declaration::Reader>_>_>_>
  ::~multimap((multimap<unsigned_int,_std::pair<unsigned_int,_capnp::compiler::Declaration::Reader>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<unsigned_int,_capnp::compiler::Declaration::Reader>_>_>_>
               *)local_48);
  return;
}

Assistant:

void NodeTranslator::compileEnum(Void decl,
                                 List<Declaration>::Reader members,
                                 schema::Node::Builder builder) {
  // maps ordinal -> (code order, declaration)
  std::multimap<uint, std::pair<uint, Declaration::Reader>> enumerants;

  uint codeOrder = 0;
  for (auto member: members) {
    if (member.isEnumerant()) {
      enumerants.insert(
          std::make_pair(member.getId().getOrdinal().getValue(),
                         std::make_pair(codeOrder++, member)));
    }
  }

  auto list = builder.initEnum().initEnumerants(enumerants.size());
  auto sourceInfoList = sourceInfo.get().initMembers(enumerants.size());
  uint i = 0;
  DuplicateOrdinalDetector dupDetector(errorReporter);

  for (auto& entry: enumerants) {
    uint codeOrder = entry.second.first;
    Declaration::Reader enumerantDecl = entry.second.second;

    dupDetector.check(enumerantDecl.getId().getOrdinal());

    if (enumerantDecl.hasDocComment()) {
      sourceInfoList[i].setDocComment(enumerantDecl.getDocComment());
    }

    auto enumerantBuilder = list[i++];
    enumerantBuilder.setName(enumerantDecl.getName().getValue());
    enumerantBuilder.setCodeOrder(codeOrder);
    enumerantBuilder.adoptAnnotations(compileAnnotationApplications(
        enumerantDecl.getAnnotations(), "targetsEnumerant"));
  }
}